

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall InterpTest_Fac_Test::InterpTest_Fac_Test(InterpTest_Fac_Test *this)

{
  Features local_1a;
  
  testing::Test::Test((Test *)this);
  (this->super_InterpTest).super_Test._vptr_Test = (_func_int **)&PTR__InterpTest_0023ae38;
  local_1a.exceptions_enabled_ = false;
  local_1a.mutable_globals_enabled_ = true;
  local_1a.sat_float_to_int_enabled_ = true;
  local_1a.sign_extension_enabled_ = true;
  local_1a.simd_enabled_ = true;
  local_1a.threads_enabled_ = false;
  local_1a.function_references_enabled_ = false;
  local_1a.multi_value_enabled_ = true;
  local_1a.tail_call_enabled_ = false;
  local_1a.bulk_memory_enabled_ = true;
  local_1a.reference_types_enabled_ = true;
  local_1a.annotations_enabled_ = false;
  local_1a.code_metadata_enabled_ = false;
  local_1a.gc_enabled_ = false;
  local_1a.memory64_enabled_ = false;
  local_1a.multi_memory_enabled_ = false;
  local_1a.extended_const_enabled_ = false;
  local_1a.relaxed_simd_enabled_ = false;
  wabt::interp::Store::Store(&(this->super_InterpTest).store_,&local_1a);
  memset(&(this->super_InterpTest).module_desc_,0,0x150);
  (this->super_InterpTest).super_Test._vptr_Test = (_func_int **)&PTR__InterpTest_0023a820;
  return;
}

Assistant:

TEST_F(InterpTest, Fac) {
  ReadModule(s_fac_module);
  Instantiate();
  auto func = GetFuncExport(0);

  Values results;
  Trap::Ptr trap;
  Result result = func->Call(store_, {Value::Make(5)}, results, &trap);

  ASSERT_EQ(Result::Ok, result);
  EXPECT_EQ(1u, results.size());
  EXPECT_EQ(120u, results[0].Get<u32>());
}